

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  Scene *pSVar87;
  undefined1 (*pauVar88) [16];
  undefined4 uVar89;
  bool bVar90;
  uint uVar91;
  ulong uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar111;
  float fVar115;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar123;
  undefined1 auVar121 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar138;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar150;
  float fVar151;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar173;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float fVar183;
  float fVar184;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar201;
  float fVar203;
  float fVar204;
  undefined1 auVar202 [32];
  float fVar205;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_630 [16];
  size_t local_620;
  Scene *local_618;
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  RTCHitN local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar87 = context->scene;
  uVar91 = line->sharedGeomID;
  uVar1 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar87->geometries).items[uVar91].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[4];
  uVar4 = (line->v0).field_0.i[5];
  auVar94._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  auVar94._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar1 * (long)p_Var11);
  auVar103._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar103._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[6];
  auVar119._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar119._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  uVar8 = (line->v0).field_0.i[7];
  auVar124._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar124._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar166._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar166._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar1 + 1) * (long)p_Var11);
  auVar174._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar174._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar175 = vunpcklps_avx(auVar94,auVar119);
  auVar208 = vunpckhps_avx(auVar94,auVar119);
  auVar186 = vunpcklps_avx(auVar103,auVar124);
  auVar170 = vunpckhps_avx(auVar103,auVar124);
  auVar51 = vunpcklps_avx(auVar175,auVar186);
  auVar220 = vunpckhps_avx(auVar175,auVar186);
  auVar52 = vunpcklps_avx(auVar208,auVar170);
  auVar222 = vunpckhps_avx(auVar208,auVar170);
  auVar95._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar95._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar104._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar104._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar175 = vunpcklps_avx(auVar166,auVar95);
  auVar208 = vunpckhps_avx(auVar166,auVar95);
  auVar186 = vunpcklps_avx(auVar174,auVar104);
  auVar170 = vunpckhps_avx(auVar174,auVar104);
  auVar103 = vunpcklps_avx(auVar175,auVar186);
  auVar94 = vunpckhps_avx(auVar175,auVar186);
  auVar104 = vunpcklps_avx(auVar208,auVar170);
  auVar95 = vunpckhps_avx(auVar208,auVar170);
  auVar93 = vpcmpeqd_avx(auVar95._0_16_,auVar95._0_16_);
  auVar101 = vpcmpeqd_avx(auVar93,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar93 = vpcmpeqd_avx(auVar93,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_230 = vshufps_avx(ZEXT416(uVar91),ZEXT416(uVar91),0);
  local_240 = local_230;
  local_260 = *(float *)(ray + k * 4 + 0x40);
  local_140 = *(float *)(ray + k * 4 + 0x50);
  local_280 = *(float *)(ray + k * 4 + 0x60);
  auVar96._16_16_ = auVar93;
  auVar96._0_16_ = auVar101;
  auVar93 = ZEXT416((uint)(local_260 * local_260 + local_140 * local_140 + local_280 * local_280));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar97._16_16_ = auVar93;
  auVar97._0_16_ = auVar93;
  auVar208 = vrcpps_avx(auVar97);
  fVar100 = auVar208._0_4_;
  fVar109 = auVar208._4_4_;
  auVar170._4_4_ = fVar109 * auVar93._4_4_;
  auVar170._0_4_ = fVar100 * auVar93._0_4_;
  fVar110 = auVar208._8_4_;
  auVar170._8_4_ = fVar110 * auVar93._8_4_;
  fVar111 = auVar208._12_4_;
  auVar170._12_4_ = fVar111 * auVar93._12_4_;
  fVar112 = auVar208._16_4_;
  auVar170._16_4_ = fVar112 * auVar93._0_4_;
  fVar113 = auVar208._20_4_;
  auVar170._20_4_ = fVar113 * auVar93._4_4_;
  fVar114 = auVar208._24_4_;
  auVar170._24_4_ = fVar114 * auVar93._8_4_;
  auVar170._28_4_ = auVar93._12_4_;
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = 0x3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar170 = vsubps_avx(auVar120,auVar170);
  auVar217._4_4_ = (auVar51._4_4_ + auVar103._4_4_) * 0.5;
  auVar217._0_4_ = (auVar51._0_4_ + auVar103._0_4_) * 0.5;
  auVar217._8_4_ = (auVar51._8_4_ + auVar103._8_4_) * 0.5;
  auVar217._12_4_ = (auVar51._12_4_ + auVar103._12_4_) * 0.5;
  auVar217._16_4_ = (auVar51._16_4_ + auVar103._16_4_) * 0.5;
  auVar217._20_4_ = (auVar51._20_4_ + auVar103._20_4_) * 0.5;
  auVar217._24_4_ = (auVar51._24_4_ + auVar103._24_4_) * 0.5;
  auVar217._28_4_ = auVar51._28_4_ + auVar103._28_4_;
  auVar175._4_4_ = (auVar94._4_4_ + auVar220._4_4_) * 0.5;
  auVar175._0_4_ = (auVar94._0_4_ + auVar220._0_4_) * 0.5;
  auVar175._8_4_ = (auVar94._8_4_ + auVar220._8_4_) * 0.5;
  auVar175._12_4_ = (auVar94._12_4_ + auVar220._12_4_) * 0.5;
  auVar175._16_4_ = (auVar94._16_4_ + auVar220._16_4_) * 0.5;
  auVar175._20_4_ = (auVar94._20_4_ + auVar220._20_4_) * 0.5;
  auVar175._24_4_ = (auVar94._24_4_ + auVar220._24_4_) * 0.5;
  auVar175._28_4_ = auVar94._28_4_ + auVar220._28_4_;
  auVar186._4_4_ = (auVar52._4_4_ + auVar104._4_4_) * 0.5;
  auVar186._0_4_ = (auVar52._0_4_ + auVar104._0_4_) * 0.5;
  auVar186._8_4_ = (auVar52._8_4_ + auVar104._8_4_) * 0.5;
  auVar186._12_4_ = (auVar52._12_4_ + auVar104._12_4_) * 0.5;
  auVar186._16_4_ = (auVar52._16_4_ + auVar104._16_4_) * 0.5;
  auVar186._20_4_ = (auVar52._20_4_ + auVar104._20_4_) * 0.5;
  auVar186._24_4_ = (auVar52._24_4_ + auVar104._24_4_) * 0.5;
  auVar186._28_4_ = 0x3f000000;
  fVar201 = *(float *)(ray + k * 4 + 0x10);
  auVar128._4_4_ = fVar201;
  auVar128._0_4_ = fVar201;
  auVar128._8_4_ = fVar201;
  auVar128._12_4_ = fVar201;
  auVar128._16_4_ = fVar201;
  auVar128._20_4_ = fVar201;
  auVar128._24_4_ = fVar201;
  auVar128._28_4_ = fVar201;
  auVar175 = vsubps_avx(auVar175,auVar128);
  fVar203 = *(float *)(ray + k * 4 + 0x20);
  auVar160._4_4_ = fVar203;
  auVar160._0_4_ = fVar203;
  auVar160._8_4_ = fVar203;
  auVar160._12_4_ = fVar203;
  auVar160._16_4_ = fVar203;
  auVar160._20_4_ = fVar203;
  auVar160._24_4_ = fVar203;
  auVar160._28_4_ = fVar203;
  auVar186 = vsubps_avx(auVar186,auVar160);
  fStack_444 = auVar175._28_4_ + auVar186._28_4_;
  fVar204 = *(float *)(ray + k * 4);
  auVar125._4_4_ = fVar204;
  auVar125._0_4_ = fVar204;
  auVar125._8_4_ = fVar204;
  auVar125._12_4_ = fVar204;
  auVar125._16_4_ = fVar204;
  auVar125._20_4_ = fVar204;
  auVar125._24_4_ = fVar204;
  auVar125._28_4_ = fVar204;
  auVar217 = vsubps_avx(auVar217,auVar125);
  fVar115 = auVar217._28_4_ + fStack_444;
  fVar116 = (local_260 * auVar217._0_4_ + local_140 * auVar175._0_4_ + auVar186._0_4_ * local_280) *
            (fVar100 + fVar100 * auVar170._0_4_);
  fVar122 = (local_260 * auVar217._4_4_ + local_140 * auVar175._4_4_ + auVar186._4_4_ * local_280) *
            (fVar109 + fVar109 * auVar170._4_4_);
  fStack_458 = (local_260 * auVar217._8_4_ + local_140 * auVar175._8_4_ + auVar186._8_4_ * local_280
               ) * (fVar110 + fVar110 * auVar170._8_4_);
  fStack_454 = (local_260 * auVar217._12_4_ +
               local_140 * auVar175._12_4_ + auVar186._12_4_ * local_280) *
               (fVar111 + fVar111 * auVar170._12_4_);
  fStack_450 = (local_260 * auVar217._16_4_ +
               local_140 * auVar175._16_4_ + auVar186._16_4_ * local_280) *
               (fVar112 + fVar112 * auVar170._16_4_);
  fStack_44c = (local_260 * auVar217._20_4_ +
               local_140 * auVar175._20_4_ + auVar186._20_4_ * local_280) *
               (fVar113 + fVar113 * auVar170._20_4_);
  fStack_448 = (local_260 * auVar217._24_4_ +
               local_140 * auVar175._24_4_ + auVar186._24_4_ * local_280) *
               (fVar114 + fVar114 * auVar170._24_4_);
  auVar98._0_4_ = fVar204 + local_260 * fVar116;
  auVar98._4_4_ = fVar204 + local_260 * fVar122;
  auVar98._8_4_ = fVar204 + local_260 * fStack_458;
  auVar98._12_4_ = fVar204 + local_260 * fStack_454;
  auVar98._16_4_ = fVar204 + local_260 * fStack_450;
  auVar98._20_4_ = fVar204 + local_260 * fStack_44c;
  auVar98._24_4_ = fVar204 + local_260 * fStack_448;
  auVar98._28_4_ = fVar204 + auVar208._28_4_ + auVar170._28_4_;
  auVar129._0_4_ = fVar201 + local_140 * fVar116;
  auVar129._4_4_ = fVar201 + local_140 * fVar122;
  auVar129._8_4_ = fVar201 + local_140 * fStack_458;
  auVar129._12_4_ = fVar201 + local_140 * fStack_454;
  auVar129._16_4_ = fVar201 + local_140 * fStack_450;
  auVar129._20_4_ = fVar201 + local_140 * fStack_44c;
  auVar129._24_4_ = fVar201 + local_140 * fStack_448;
  auVar129._28_4_ = fVar201 + fVar115;
  local_460 = (Primitive *)CONCAT44(fVar122,fVar116);
  auVar105._0_4_ = fVar203 + local_280 * fVar116;
  auVar105._4_4_ = fVar203 + local_280 * fVar122;
  auVar105._8_4_ = fVar203 + local_280 * fStack_458;
  auVar105._12_4_ = fVar203 + local_280 * fStack_454;
  auVar105._16_4_ = fVar203 + local_280 * fStack_450;
  auVar105._20_4_ = fVar203 + local_280 * fStack_44c;
  auVar105._24_4_ = fVar203 + local_280 * fStack_448;
  auVar105._28_4_ = fVar203 + fVar115;
  local_3e0 = vsubps_avx(auVar94,auVar220);
  local_400 = vsubps_avx(auVar104,auVar52);
  fVar201 = local_400._0_4_;
  fVar112 = local_400._4_4_;
  fVar16 = local_400._8_4_;
  fVar23 = local_400._12_4_;
  fVar30 = local_400._16_4_;
  fVar37 = local_400._20_4_;
  fVar44 = local_400._24_4_;
  fVar203 = local_3e0._0_4_;
  fVar113 = local_3e0._4_4_;
  fVar17 = local_3e0._8_4_;
  fVar24 = local_3e0._12_4_;
  fVar31 = local_3e0._16_4_;
  fVar38 = local_3e0._20_4_;
  fVar45 = local_3e0._24_4_;
  local_5a0 = vsubps_avx(auVar103,auVar51);
  fVar100 = local_5a0._0_4_;
  fVar114 = local_5a0._4_4_;
  fVar18 = local_5a0._8_4_;
  fVar25 = local_5a0._12_4_;
  fVar32 = local_5a0._16_4_;
  fVar39 = local_5a0._20_4_;
  fVar46 = local_5a0._24_4_;
  fVar183 = fVar100 * fVar100 + fVar203 * fVar203 + fVar201 * fVar201;
  fVar188 = fVar114 * fVar114 + fVar113 * fVar113 + fVar112 * fVar112;
  fVar190 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fVar192 = fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23;
  fVar194 = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
  fVar196 = fVar39 * fVar39 + fVar38 * fVar38 + fVar37 * fVar37;
  fVar198 = fVar46 * fVar46 + fVar45 * fVar45 + fVar44 * fVar44;
  fVar200 = fVar204 + fVar204 + fStack_444;
  local_4c0 = vsubps_avx(auVar129,auVar220);
  local_420 = vsubps_avx(auVar105,auVar52);
  fVar109 = local_420._0_4_;
  fVar115 = local_420._4_4_;
  fVar19 = local_420._8_4_;
  fVar26 = local_420._12_4_;
  fVar33 = local_420._16_4_;
  fVar40 = local_420._20_4_;
  fVar47 = local_420._24_4_;
  fVar110 = local_4c0._0_4_;
  fVar13 = local_4c0._4_4_;
  fVar20 = local_4c0._8_4_;
  fVar27 = local_4c0._12_4_;
  fVar34 = local_4c0._16_4_;
  fVar41 = local_4c0._20_4_;
  fVar48 = local_4c0._24_4_;
  fVar123 = auVar129._28_4_ + fVar204 + fStack_444;
  local_4e0 = vsubps_avx(auVar98,auVar51);
  fVar204 = local_4e0._0_4_;
  fVar14 = local_4e0._4_4_;
  fVar21 = local_4e0._8_4_;
  fVar28 = local_4e0._12_4_;
  fVar35 = local_4e0._16_4_;
  fVar42 = local_4e0._20_4_;
  fVar49 = local_4e0._24_4_;
  fVar205 = fVar100 * fVar204 + fVar203 * fVar110 + fVar201 * fVar109;
  fVar210 = fVar114 * fVar14 + fVar113 * fVar13 + fVar112 * fVar115;
  fVar211 = fVar18 * fVar21 + fVar17 * fVar20 + fVar16 * fVar19;
  fVar212 = fVar25 * fVar28 + fVar24 * fVar27 + fVar23 * fVar26;
  fVar213 = fVar32 * fVar35 + fVar31 * fVar34 + fVar30 * fVar33;
  fVar214 = fVar39 * fVar42 + fVar38 * fVar41 + fVar37 * fVar40;
  fVar215 = fVar46 * fVar49 + fVar45 * fVar48 + fVar44 * fVar47;
  fVar216 = auVar129._28_4_ + fVar123;
  fVar123 = auVar129._28_4_ + fVar123;
  auVar202._0_4_ = fVar100 * local_260 + local_140 * fVar203 + fVar201 * local_280;
  auVar202._4_4_ = fVar114 * local_260 + local_140 * fVar113 + fVar112 * local_280;
  auVar202._8_4_ = fVar18 * local_260 + local_140 * fVar17 + fVar16 * local_280;
  auVar202._12_4_ = fVar25 * local_260 + local_140 * fVar24 + fVar23 * local_280;
  auVar202._16_4_ = fVar32 * local_260 + local_140 * fVar31 + fVar30 * local_280;
  auVar202._20_4_ = fVar39 * local_260 + local_140 * fVar38 + fVar37 * local_280;
  auVar202._24_4_ = fVar46 * local_260 + local_140 * fVar45 + fVar44 * local_280;
  auVar202._28_4_ = auVar129._28_4_ + fVar123;
  fStack_13c = local_140;
  fStack_138 = local_140;
  fStack_134 = local_140;
  fStack_130 = local_140;
  fStack_12c = local_140;
  fStack_128 = local_140;
  fStack_124 = local_140;
  auVar208 = vsubps_avx(auVar222,auVar95);
  fVar111 = auVar208._0_4_;
  fVar15 = auVar208._4_4_;
  fVar22 = auVar208._8_4_;
  fVar29 = auVar208._12_4_;
  fVar36 = auVar208._16_4_;
  fVar43 = auVar208._20_4_;
  fVar50 = auVar208._24_4_;
  local_2e0 = fVar183 + fVar111 * fVar111;
  fStack_2dc = fVar188 + fVar15 * fVar15;
  fStack_2d8 = fVar190 + fVar22 * fVar22;
  fStack_2d4 = fVar192 + fVar29 * fVar29;
  fStack_2d0 = fVar194 + fVar36 * fVar36;
  fStack_2cc = fVar196 + fVar43 * fVar43;
  fStack_2c8 = fVar198 + fVar50 * fVar50;
  fStack_2c4 = fVar200 + local_280;
  fVar138 = fVar183 * fVar183;
  fVar144 = fVar188 * fVar188;
  local_160._4_4_ = fVar144;
  local_160._0_4_ = fVar138;
  fVar145 = fVar190 * fVar190;
  fStack_158 = fVar145;
  fVar146 = fVar192 * fVar192;
  fStack_154 = fVar146;
  fVar147 = fVar194 * fVar194;
  fStack_150 = fVar147;
  fVar148 = fVar196 * fVar196;
  fStack_14c = fVar148;
  fVar149 = fVar198 * fVar198;
  fStack_148 = fVar149;
  uStack_144 = local_280;
  auVar220._4_4_ = fVar144 * (local_260 * fVar14 + local_140 * fVar13 + local_280 * fVar115);
  auVar220._0_4_ = fVar138 * (local_260 * fVar204 + local_140 * fVar110 + local_280 * fVar109);
  auVar220._8_4_ = fVar145 * (local_260 * fVar21 + local_140 * fVar20 + local_280 * fVar19);
  auVar220._12_4_ = fVar146 * (local_260 * fVar28 + local_140 * fVar27 + local_280 * fVar26);
  auVar220._16_4_ = fVar147 * (local_260 * fVar35 + local_140 * fVar34 + local_280 * fVar33);
  auVar220._20_4_ = fVar148 * (local_260 * fVar42 + local_140 * fVar41 + local_280 * fVar40);
  auVar220._24_4_ = fVar149 * (local_260 * fVar49 + local_140 * fVar48 + local_280 * fVar47);
  auVar220._28_4_ = auVar129._28_4_ + auVar129._28_4_ + fVar123;
  fVar123 = local_420._28_4_;
  auVar51._4_4_ = fStack_2dc * auVar202._4_4_ * fVar210;
  auVar51._0_4_ = local_2e0 * auVar202._0_4_ * fVar205;
  auVar51._8_4_ = fStack_2d8 * auVar202._8_4_ * fVar211;
  auVar51._12_4_ = fStack_2d4 * auVar202._12_4_ * fVar212;
  auVar51._16_4_ = fStack_2d0 * auVar202._16_4_ * fVar213;
  auVar51._20_4_ = fStack_2cc * auVar202._20_4_ * fVar214;
  auVar51._24_4_ = fStack_2c8 * auVar202._24_4_ * fVar215;
  auVar51._28_4_ = fVar123;
  auVar170 = vsubps_avx(auVar220,auVar51);
  fVar127 = auVar222._0_4_;
  fVar150 = fVar127 * fVar183;
  fVar132 = auVar222._4_4_;
  fVar154 = fVar132 * fVar188;
  auVar52._4_4_ = fVar154;
  auVar52._0_4_ = fVar150;
  fVar133 = auVar222._8_4_;
  fVar155 = fVar133 * fVar190;
  auVar52._8_4_ = fVar155;
  fVar134 = auVar222._12_4_;
  fVar156 = fVar134 * fVar192;
  auVar52._12_4_ = fVar156;
  fVar135 = auVar222._16_4_;
  fVar157 = fVar135 * fVar194;
  auVar52._16_4_ = fVar157;
  fVar136 = auVar222._20_4_;
  fVar158 = fVar136 * fVar196;
  auVar52._20_4_ = fVar158;
  fVar137 = auVar222._24_4_;
  fVar159 = fVar137 * fVar198;
  auVar52._24_4_ = fVar159;
  auVar52._28_4_ = fVar123;
  auVar161._0_4_ = fVar150 * fVar111 * auVar202._0_4_ + auVar170._0_4_;
  auVar161._4_4_ = fVar154 * fVar15 * auVar202._4_4_ + auVar170._4_4_;
  auVar161._8_4_ = fVar155 * fVar22 * auVar202._8_4_ + auVar170._8_4_;
  auVar161._12_4_ = fVar156 * fVar29 * auVar202._12_4_ + auVar170._12_4_;
  auVar161._16_4_ = fVar157 * fVar36 * auVar202._16_4_ + auVar170._16_4_;
  auVar161._20_4_ = fVar158 * fVar43 * auVar202._20_4_ + auVar170._20_4_;
  auVar161._24_4_ = fVar159 * fVar50 * auVar202._24_4_ + auVar170._24_4_;
  auVar161._28_4_ = local_3e0._28_4_ + auVar170._28_4_;
  auVar222._4_4_ = fVar144 * (fVar14 * fVar14 + fVar13 * fVar13 + fVar115 * fVar115);
  auVar222._0_4_ = fVar138 * (fVar204 * fVar204 + fVar110 * fVar110 + fVar109 * fVar109);
  auVar222._8_4_ = fVar145 * (fVar21 * fVar21 + fVar20 * fVar20 + fVar19 * fVar19);
  auVar222._12_4_ = fVar146 * (fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26);
  auVar222._16_4_ = fVar147 * (fVar35 * fVar35 + fVar34 * fVar34 + fVar33 * fVar33);
  auVar222._20_4_ = fVar148 * (fVar42 * fVar42 + fVar41 * fVar41 + fVar40 * fVar40);
  auVar222._24_4_ = fVar149 * (fVar49 * fVar49 + fVar48 * fVar48 + fVar47 * fVar47);
  auVar222._28_4_ = auVar170._28_4_;
  auVar53._4_4_ = fStack_2dc * fVar210 * fVar210;
  auVar53._0_4_ = local_2e0 * fVar205 * fVar205;
  auVar53._8_4_ = fStack_2d8 * fVar211 * fVar211;
  auVar53._12_4_ = fStack_2d4 * fVar212 * fVar212;
  auVar53._16_4_ = fStack_2d0 * fVar213 * fVar213;
  auVar53._20_4_ = fStack_2cc * fVar214 * fVar214;
  auVar53._24_4_ = fStack_2c8 * fVar215 * fVar215;
  auVar53._28_4_ = local_280 + local_280 + auVar129._28_4_;
  auVar170 = vsubps_avx(auVar222,auVar53);
  auVar54._4_4_ = fVar210 * (fVar15 + fVar15);
  auVar54._0_4_ = fVar205 * (fVar111 + fVar111);
  auVar54._8_4_ = fVar211 * (fVar22 + fVar22);
  auVar54._12_4_ = fVar212 * (fVar29 + fVar29);
  auVar54._16_4_ = fVar213 * (fVar36 + fVar36);
  auVar54._20_4_ = fVar214 * (fVar43 + fVar43);
  auVar54._24_4_ = fVar215 * (fVar50 + fVar50);
  auVar54._28_4_ = auVar208._28_4_ + auVar208._28_4_;
  auVar208 = vsubps_avx(auVar54,auVar52);
  fVar151 = auVar208._28_4_;
  fVar184 = auVar202._0_4_ * auVar202._0_4_;
  fVar189 = auVar202._4_4_ * auVar202._4_4_;
  fVar191 = auVar202._8_4_ * auVar202._8_4_;
  fVar193 = auVar202._12_4_ * auVar202._12_4_;
  fVar195 = auVar202._16_4_ * auVar202._16_4_;
  fVar197 = auVar202._20_4_ * auVar202._20_4_;
  fVar199 = auVar202._24_4_ * auVar202._24_4_;
  auVar55._4_4_ = fVar189 * fStack_2dc;
  auVar55._0_4_ = fVar184 * local_2e0;
  auVar55._8_4_ = fVar191 * fStack_2d8;
  auVar55._12_4_ = fVar193 * fStack_2d4;
  auVar55._16_4_ = fVar195 * fStack_2d0;
  auVar55._20_4_ = fVar197 * fStack_2cc;
  auVar55._24_4_ = fVar199 * fStack_2c8;
  auVar55._28_4_ = fVar151;
  auVar175 = vsubps_avx(_local_160,auVar55);
  auVar56._4_4_ = auVar175._4_4_ * (auVar170._4_4_ + fVar154 * auVar208._4_4_);
  auVar56._0_4_ = auVar175._0_4_ * (auVar170._0_4_ + fVar150 * auVar208._0_4_);
  auVar56._8_4_ = auVar175._8_4_ * (auVar170._8_4_ + fVar155 * auVar208._8_4_);
  auVar56._12_4_ = auVar175._12_4_ * (auVar170._12_4_ + fVar156 * auVar208._12_4_);
  auVar56._16_4_ = auVar175._16_4_ * (auVar170._16_4_ + fVar157 * auVar208._16_4_);
  auVar56._20_4_ = auVar175._20_4_ * (auVar170._20_4_ + fVar158 * auVar208._20_4_);
  auVar56._24_4_ = auVar175._24_4_ * (auVar170._24_4_ + fVar159 * auVar208._24_4_);
  auVar56._28_4_ = auVar170._28_4_ + fVar151;
  auVar208._4_4_ = auVar161._4_4_ * auVar161._4_4_;
  auVar208._0_4_ = auVar161._0_4_ * auVar161._0_4_;
  auVar208._8_4_ = auVar161._8_4_ * auVar161._8_4_;
  auVar208._12_4_ = auVar161._12_4_ * auVar161._12_4_;
  auVar208._16_4_ = auVar161._16_4_ * auVar161._16_4_;
  auVar208._20_4_ = auVar161._20_4_ * auVar161._20_4_;
  auVar208._24_4_ = auVar161._24_4_ * auVar161._24_4_;
  auVar208._28_4_ = fVar151;
  auVar170 = vsubps_avx(auVar208,auVar56);
  uVar92 = (ulong)((line->leftExists & 0xf) << 4);
  auVar208 = vcmpps_avx(auVar170,ZEXT432(0) << 0x20,5);
  auVar186 = auVar208 & ~auVar96;
  if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar186 >> 0x7f,0) != '\0') ||
        (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar186 >> 0xbf,0) != '\0') ||
      (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar186[0x1f] < '\0')
  {
    auVar186 = vandnps_avx(auVar96,auVar208);
    auVar222 = vsubps_avx(auVar98,auVar103);
    auVar94 = vsubps_avx(auVar129,auVar94);
    auVar51 = vsubps_avx(auVar105,auVar104);
    fVar173 = auVar222._0_4_ * fVar100 + auVar51._0_4_ * fVar201 + auVar94._0_4_ * fVar203;
    fVar177 = auVar222._4_4_ * fVar114 + auVar51._4_4_ * fVar112 + auVar94._4_4_ * fVar113;
    fVar178 = auVar222._8_4_ * fVar18 + auVar51._8_4_ * fVar16 + auVar94._8_4_ * fVar17;
    fVar179 = auVar222._12_4_ * fVar25 + auVar51._12_4_ * fVar23 + auVar94._12_4_ * fVar24;
    fVar180 = auVar222._16_4_ * fVar32 + auVar51._16_4_ * fVar30 + auVar94._16_4_ * fVar31;
    fVar181 = auVar222._20_4_ * fVar39 + auVar51._20_4_ * fVar37 + auVar94._20_4_ * fVar38;
    fVar182 = auVar222._24_4_ * fVar46 + auVar51._24_4_ * fVar44 + auVar94._24_4_ * fVar45;
    auVar170 = vsqrtps_avx(auVar170);
    auVar208 = vrcpps_avx(auVar175);
    fStack_2b4 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar92 + 8) >> 0x20);
    fVar151 = auVar208._0_4_;
    auVar219._0_4_ = auVar175._0_4_ * fVar151;
    fVar150 = auVar208._4_4_;
    auVar219._4_4_ = auVar175._4_4_ * fVar150;
    fVar154 = auVar208._8_4_;
    auVar219._8_4_ = auVar175._8_4_ * fVar154;
    fVar155 = auVar208._12_4_;
    auVar219._12_4_ = auVar175._12_4_ * fVar155;
    fVar156 = auVar208._16_4_;
    auVar219._16_4_ = auVar175._16_4_ * fVar156;
    fVar157 = auVar208._20_4_;
    auVar219._20_4_ = auVar175._20_4_ * fVar157;
    fVar158 = auVar208._24_4_;
    auVar219._24_4_ = auVar175._24_4_ * fVar158;
    auVar219._28_4_ = 0;
    auVar139._8_4_ = 0x3f800000;
    auVar139._0_8_ = 0x3f8000003f800000;
    auVar139._12_4_ = 0x3f800000;
    auVar139._16_4_ = 0x3f800000;
    auVar139._20_4_ = 0x3f800000;
    auVar139._24_4_ = 0x3f800000;
    auVar139._28_4_ = 0x3f800000;
    auVar217 = vsubps_avx(auVar139,auVar219);
    auVar121._8_4_ = 0x7fffffff;
    auVar121._0_8_ = 0x7fffffff7fffffff;
    auVar121._12_4_ = 0x7fffffff;
    auVar121._16_4_ = 0x7fffffff;
    auVar121._20_4_ = 0x7fffffff;
    auVar121._24_4_ = 0x7fffffff;
    auVar121._28_4_ = 0x7fffffff;
    fVar151 = auVar217._0_4_ * fVar151 + fVar151;
    fVar150 = auVar217._4_4_ * fVar150 + fVar150;
    fVar154 = auVar217._8_4_ * fVar154 + fVar154;
    fVar155 = auVar217._12_4_ * fVar155 + fVar155;
    fVar156 = auVar217._16_4_ * fVar156 + fVar156;
    fVar157 = auVar217._20_4_ * fVar157 + fVar157;
    fVar158 = auVar217._24_4_ * fVar158 + fVar158;
    fVar159 = auVar217._28_4_ + auVar208._28_4_;
    auVar208 = vandps_avx(auVar175,auVar121);
    auVar167._8_4_ = 0x219392ef;
    auVar167._0_8_ = 0x219392ef219392ef;
    auVar167._12_4_ = 0x219392ef;
    auVar167._16_4_ = 0x219392ef;
    auVar167._20_4_ = 0x219392ef;
    auVar167._24_4_ = 0x219392ef;
    auVar167._28_4_ = 0x219392ef;
    auVar208 = vcmpps_avx(auVar208,auVar167,2);
    uVar12 = CONCAT44(auVar161._4_4_,auVar161._0_4_);
    auVar168._0_8_ = uVar12 ^ 0x8000000080000000;
    auVar168._8_4_ = -auVar161._8_4_;
    auVar168._12_4_ = -auVar161._12_4_;
    auVar168._16_4_ = -auVar161._16_4_;
    auVar168._20_4_ = -auVar161._20_4_;
    auVar168._24_4_ = -auVar161._24_4_;
    auVar168._28_4_ = -auVar161._28_4_;
    auVar175 = vsubps_avx(auVar168,auVar170);
    auVar170 = vsubps_avx(auVar170,auVar161);
    auVar57._4_4_ = auVar175._4_4_ * fVar150;
    auVar57._0_4_ = auVar175._0_4_ * fVar151;
    auVar57._8_4_ = auVar175._8_4_ * fVar154;
    auVar57._12_4_ = auVar175._12_4_ * fVar155;
    auVar57._16_4_ = auVar175._16_4_ * fVar156;
    auVar57._20_4_ = auVar175._20_4_ * fVar157;
    auVar57._24_4_ = auVar175._24_4_ * fVar158;
    auVar57._28_4_ = auVar161._28_4_;
    auVar58._4_4_ = auVar170._4_4_ * fVar150;
    auVar58._0_4_ = auVar170._0_4_ * fVar151;
    auVar58._8_4_ = auVar170._8_4_ * fVar154;
    auVar58._12_4_ = auVar170._12_4_ * fVar155;
    auVar58._16_4_ = auVar170._16_4_ * fVar156;
    auVar58._20_4_ = auVar170._20_4_ * fVar157;
    auVar58._24_4_ = auVar170._24_4_ * fVar158;
    auVar58._28_4_ = fVar159;
    auVar106._8_4_ = 0xff800000;
    auVar106._0_8_ = 0xff800000ff800000;
    auVar106._12_4_ = 0xff800000;
    auVar106._16_4_ = 0xff800000;
    auVar106._20_4_ = 0xff800000;
    auVar106._24_4_ = 0xff800000;
    auVar106._28_4_ = 0xff800000;
    auVar170 = vblendvps_avx(auVar57,auVar106,auVar208);
    auVar99._8_4_ = 0x7f800000;
    auVar99._0_8_ = 0x7f8000007f800000;
    auVar99._12_4_ = 0x7f800000;
    auVar99._16_4_ = 0x7f800000;
    auVar99._20_4_ = 0x7f800000;
    auVar99._24_4_ = 0x7f800000;
    auVar99._28_4_ = 0x7f800000;
    auVar175 = vblendvps_avx(auVar58,auVar99,auVar208);
    auVar126._0_4_ = fVar205 + auVar202._0_4_ * auVar170._0_4_;
    auVar126._4_4_ = fVar210 + auVar202._4_4_ * auVar170._4_4_;
    auVar126._8_4_ = fVar211 + auVar202._8_4_ * auVar170._8_4_;
    auVar126._12_4_ = fVar212 + auVar202._12_4_ * auVar170._12_4_;
    auVar126._16_4_ = fVar213 + auVar202._16_4_ * auVar170._16_4_;
    auVar126._20_4_ = fVar214 + auVar202._20_4_ * auVar170._20_4_;
    auVar126._24_4_ = fVar215 + auVar202._24_4_ * auVar170._24_4_;
    auVar126._28_4_ = fVar216 + fVar159;
    auVar208 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,6);
    auVar84._4_4_ = fVar188;
    auVar84._0_4_ = fVar183;
    auVar84._8_4_ = fVar190;
    auVar84._12_4_ = fVar192;
    auVar84._16_4_ = fVar194;
    auVar84._20_4_ = fVar196;
    auVar84._24_4_ = fVar198;
    auVar84._28_4_ = fVar200;
    auVar217 = vcmpps_avx(auVar126,auVar84,1);
    auVar208 = vandps_avx(auVar217,auVar208);
    auVar208 = vandps_avx(auVar186,auVar208);
    local_480 = vblendvps_avx(auVar99,auVar170,auVar208);
    local_4a0._0_4_ = fVar205 + auVar202._0_4_ * auVar175._0_4_;
    local_4a0._4_4_ = fVar210 + auVar202._4_4_ * auVar175._4_4_;
    fStack_498 = fVar211 + auVar202._8_4_ * auVar175._8_4_;
    fStack_494 = fVar212 + auVar202._12_4_ * auVar175._12_4_;
    fStack_490 = fVar213 + auVar202._16_4_ * auVar175._16_4_;
    fStack_48c = fVar214 + auVar202._20_4_ * auVar175._20_4_;
    fStack_488 = fVar215 + auVar202._24_4_ * auVar175._24_4_;
    register0x000012dc = fVar216 + auVar208._28_4_;
    auVar208 = vcmpps_avx(_local_4a0,ZEXT832(0) << 0x20,6);
    auVar170 = vcmpps_avx(_local_4a0,auVar84,1);
    auVar208 = vandps_avx(auVar170,auVar208);
    auVar208 = vandps_avx(auVar186,auVar208);
    auVar175 = vblendvps_avx(auVar106,auVar175,auVar208);
    auVar220 = vrcpps_avx(auVar202);
    fVar151 = auVar220._0_4_;
    fVar150 = auVar220._4_4_;
    auVar59._4_4_ = auVar202._4_4_ * fVar150;
    auVar59._0_4_ = auVar202._0_4_ * fVar151;
    fVar154 = auVar220._8_4_;
    auVar59._8_4_ = auVar202._8_4_ * fVar154;
    fVar155 = auVar220._12_4_;
    auVar59._12_4_ = auVar202._12_4_ * fVar155;
    fVar156 = auVar220._16_4_;
    auVar59._16_4_ = auVar202._16_4_ * fVar156;
    fVar157 = auVar220._20_4_;
    auVar59._20_4_ = auVar202._20_4_ * fVar157;
    fVar158 = auVar220._24_4_;
    auVar59._24_4_ = auVar202._24_4_ * fVar158;
    auVar59._28_4_ = auVar208._28_4_;
    auVar208 = vsubps_avx(auVar139,auVar59);
    fVar151 = fVar151 + fVar151 * auVar208._0_4_;
    fVar150 = fVar150 + fVar150 * auVar208._4_4_;
    fVar154 = fVar154 + fVar154 * auVar208._8_4_;
    fVar155 = fVar155 + fVar155 * auVar208._12_4_;
    fVar156 = fVar156 + fVar156 * auVar208._16_4_;
    fVar157 = fVar157 + fVar157 * auVar208._20_4_;
    fVar158 = fVar158 + fVar158 * auVar208._24_4_;
    fStack_2e4 = auVar220._28_4_ + auVar208._28_4_;
    auVar60._4_4_ = auVar202._4_4_ * fVar14;
    auVar60._0_4_ = auVar202._0_4_ * fVar204;
    auVar60._8_4_ = auVar202._8_4_ * fVar21;
    auVar60._12_4_ = auVar202._12_4_ * fVar28;
    auVar60._16_4_ = auVar202._16_4_ * fVar35;
    auVar60._20_4_ = auVar202._20_4_ * fVar42;
    auVar60._24_4_ = auVar202._24_4_ * fVar49;
    auVar60._28_4_ = auVar208._28_4_;
    auVar61._4_4_ = local_260 * fVar210;
    auVar61._0_4_ = local_260 * fVar205;
    auVar61._8_4_ = local_260 * fVar211;
    auVar61._12_4_ = local_260 * fVar212;
    auVar61._16_4_ = local_260 * fVar213;
    auVar61._20_4_ = local_260 * fVar214;
    auVar61._24_4_ = local_260 * fVar215;
    auVar61._28_4_ = auVar170._28_4_;
    auVar208 = vsubps_avx(auVar60,auVar61);
    auVar62._4_4_ = auVar202._4_4_ * fVar13;
    auVar62._0_4_ = auVar202._0_4_ * fVar110;
    auVar62._8_4_ = auVar202._8_4_ * fVar20;
    auVar62._12_4_ = auVar202._12_4_ * fVar27;
    auVar62._16_4_ = auVar202._16_4_ * fVar34;
    auVar62._20_4_ = auVar202._20_4_ * fVar41;
    auVar62._24_4_ = auVar202._24_4_ * fVar48;
    auVar62._28_4_ = auVar170._28_4_;
    auVar63._4_4_ = fVar210 * local_140;
    auVar63._0_4_ = fVar205 * local_140;
    auVar63._8_4_ = fVar211 * local_140;
    auVar63._12_4_ = fVar212 * local_140;
    auVar63._16_4_ = fVar213 * local_140;
    auVar63._20_4_ = fVar214 * local_140;
    auVar63._24_4_ = fVar215 * local_140;
    auVar63._28_4_ = auVar217._28_4_;
    auVar170 = vsubps_avx(auVar62,auVar63);
    auVar64._4_4_ = auVar202._4_4_ * fVar115;
    auVar64._0_4_ = auVar202._0_4_ * fVar109;
    auVar64._8_4_ = auVar202._8_4_ * fVar19;
    auVar64._12_4_ = auVar202._12_4_ * fVar26;
    auVar64._16_4_ = auVar202._16_4_ * fVar33;
    auVar64._20_4_ = auVar202._20_4_ * fVar40;
    auVar64._24_4_ = auVar202._24_4_ * fVar47;
    auVar64._28_4_ = auVar217._28_4_;
    auVar65._4_4_ = fVar210 * local_280;
    auVar65._0_4_ = fVar205 * local_280;
    auVar65._8_4_ = fVar211 * local_280;
    auVar65._12_4_ = fVar212 * local_280;
    auVar65._16_4_ = fVar213 * local_280;
    auVar65._20_4_ = fVar214 * local_280;
    auVar65._24_4_ = fVar215 * local_280;
    auVar65._28_4_ = 0x3f800000;
    auVar217 = vsubps_avx(auVar64,auVar65);
    fVar159 = auVar170._28_4_;
    auVar140._0_4_ =
         auVar208._0_4_ * auVar208._0_4_ +
         auVar170._0_4_ * auVar170._0_4_ + auVar217._0_4_ * auVar217._0_4_;
    auVar140._4_4_ =
         auVar208._4_4_ * auVar208._4_4_ +
         auVar170._4_4_ * auVar170._4_4_ + auVar217._4_4_ * auVar217._4_4_;
    auVar140._8_4_ =
         auVar208._8_4_ * auVar208._8_4_ +
         auVar170._8_4_ * auVar170._8_4_ + auVar217._8_4_ * auVar217._8_4_;
    auVar140._12_4_ =
         auVar208._12_4_ * auVar208._12_4_ +
         auVar170._12_4_ * auVar170._12_4_ + auVar217._12_4_ * auVar217._12_4_;
    auVar140._16_4_ =
         auVar208._16_4_ * auVar208._16_4_ +
         auVar170._16_4_ * auVar170._16_4_ + auVar217._16_4_ * auVar217._16_4_;
    auVar140._20_4_ =
         auVar208._20_4_ * auVar208._20_4_ +
         auVar170._20_4_ * auVar170._20_4_ + auVar217._20_4_ * auVar217._20_4_;
    auVar140._24_4_ =
         auVar208._24_4_ * auVar208._24_4_ +
         auVar170._24_4_ * auVar170._24_4_ + auVar217._24_4_ * auVar217._24_4_;
    auVar140._28_4_ = auVar208._28_4_ + fVar159 + auVar217._28_4_;
    auVar66._4_4_ = fVar189 * fVar132 * fVar132;
    auVar66._0_4_ = fVar184 * fVar127 * fVar127;
    auVar66._8_4_ = fVar191 * fVar133 * fVar133;
    auVar66._12_4_ = fVar193 * fVar134 * fVar134;
    auVar66._16_4_ = fVar195 * fVar135 * fVar135;
    auVar66._20_4_ = fVar197 * fVar136 * fVar136;
    auVar66._24_4_ = fVar199 * fVar137 * fVar137;
    auVar66._28_4_ = auVar208._28_4_;
    auVar208 = vcmpps_avx(auVar140,auVar66,1);
    auVar67._4_4_ = fVar150 * -fVar210;
    auVar67._0_4_ = fVar151 * -fVar205;
    auVar67._8_4_ = fVar154 * -fVar211;
    auVar67._12_4_ = fVar155 * -fVar212;
    auVar67._16_4_ = fVar156 * -fVar213;
    auVar67._20_4_ = fVar157 * -fVar214;
    auVar67._24_4_ = fVar158 * -fVar215;
    auVar67._28_4_ = -fVar216;
    auVar206._8_4_ = 0x7f800000;
    auVar206._0_8_ = 0x7f8000007f800000;
    auVar206._12_4_ = 0x7f800000;
    auVar206._16_4_ = 0x7f800000;
    auVar206._20_4_ = 0x7f800000;
    auVar206._24_4_ = 0x7f800000;
    auVar206._28_4_ = 0x7f800000;
    auVar170 = vblendvps_avx(auVar206,auVar67,auVar208);
    auVar152._12_4_ = fStack_2b4;
    auVar152._0_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar92);
    auVar152._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar208 = vandnps_avx(auVar152,auVar186);
    local_440 = vblendvps_avx(auVar206,auVar170,auVar208);
    auVar141._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar141._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar130._0_4_ = auVar202._0_4_ * auVar222._0_4_;
    auVar130._4_4_ = auVar202._4_4_ * auVar222._4_4_;
    auVar130._8_4_ = auVar202._8_4_ * auVar222._8_4_;
    auVar130._12_4_ = auVar202._12_4_ * auVar222._12_4_;
    auVar130._16_4_ = auVar202._16_4_ * auVar222._16_4_;
    auVar130._20_4_ = auVar202._20_4_ * auVar222._20_4_;
    auVar130._24_4_ = auVar202._24_4_ * auVar222._24_4_;
    auVar130._28_4_ = 0;
    auVar68._4_4_ = auVar202._4_4_ * auVar94._4_4_;
    auVar68._0_4_ = auVar202._0_4_ * auVar94._0_4_;
    auVar68._8_4_ = auVar202._8_4_ * auVar94._8_4_;
    auVar68._12_4_ = auVar202._12_4_ * auVar94._12_4_;
    auVar68._16_4_ = auVar202._16_4_ * auVar94._16_4_;
    auVar68._20_4_ = auVar202._20_4_ * auVar94._20_4_;
    auVar68._24_4_ = auVar202._24_4_ * auVar94._24_4_;
    auVar68._28_4_ = auVar208._28_4_;
    auVar69._4_4_ = auVar202._4_4_ * auVar51._4_4_;
    auVar69._0_4_ = auVar202._0_4_ * auVar51._0_4_;
    auVar69._8_4_ = auVar202._8_4_ * auVar51._8_4_;
    auVar69._12_4_ = auVar202._12_4_ * auVar51._12_4_;
    auVar69._16_4_ = auVar202._16_4_ * auVar51._16_4_;
    auVar69._20_4_ = auVar202._20_4_ * auVar51._20_4_;
    auVar69._24_4_ = auVar202._24_4_ * auVar51._24_4_;
    auVar69._28_4_ = 0;
    auVar70._4_4_ = local_260 * fVar177;
    auVar70._0_4_ = local_260 * fVar173;
    auVar70._8_4_ = local_260 * fVar178;
    auVar70._12_4_ = local_260 * fVar179;
    auVar70._16_4_ = local_260 * fVar180;
    auVar70._20_4_ = local_260 * fVar181;
    auVar70._24_4_ = local_260 * fVar182;
    auVar70._28_4_ = fVar159;
    auVar208 = vsubps_avx(auVar130,auVar70);
    auVar71._4_4_ = fVar177 * local_140;
    auVar71._0_4_ = fVar173 * local_140;
    auVar71._8_4_ = fVar178 * local_140;
    auVar71._12_4_ = fVar179 * local_140;
    auVar71._16_4_ = fVar180 * local_140;
    auVar71._20_4_ = fVar181 * local_140;
    auVar71._24_4_ = fVar182 * local_140;
    auVar71._28_4_ = fVar159;
    auVar170 = vsubps_avx(auVar68,auVar71);
    auVar72._4_4_ = fVar177 * local_280;
    auVar72._0_4_ = fVar173 * local_280;
    auVar72._8_4_ = fVar178 * local_280;
    auVar72._12_4_ = fVar179 * local_280;
    auVar72._16_4_ = fVar180 * local_280;
    auVar72._20_4_ = fVar181 * local_280;
    auVar72._24_4_ = fVar182 * local_280;
    auVar72._28_4_ = fVar159;
    auVar217 = vsubps_avx(auVar69,auVar72);
    auVar107._0_4_ =
         auVar208._0_4_ * auVar208._0_4_ +
         auVar170._0_4_ * auVar170._0_4_ + auVar217._0_4_ * auVar217._0_4_;
    auVar107._4_4_ =
         auVar208._4_4_ * auVar208._4_4_ +
         auVar170._4_4_ * auVar170._4_4_ + auVar217._4_4_ * auVar217._4_4_;
    auVar107._8_4_ =
         auVar208._8_4_ * auVar208._8_4_ +
         auVar170._8_4_ * auVar170._8_4_ + auVar217._8_4_ * auVar217._8_4_;
    auVar107._12_4_ =
         auVar208._12_4_ * auVar208._12_4_ +
         auVar170._12_4_ * auVar170._12_4_ + auVar217._12_4_ * auVar217._12_4_;
    auVar107._16_4_ =
         auVar208._16_4_ * auVar208._16_4_ +
         auVar170._16_4_ * auVar170._16_4_ + auVar217._16_4_ * auVar217._16_4_;
    auVar107._20_4_ =
         auVar208._20_4_ * auVar208._20_4_ +
         auVar170._20_4_ * auVar170._20_4_ + auVar217._20_4_ * auVar217._20_4_;
    auVar107._24_4_ =
         auVar208._24_4_ * auVar208._24_4_ +
         auVar170._24_4_ * auVar170._24_4_ + auVar217._24_4_ * auVar217._24_4_;
    auVar107._28_4_ = auVar208._28_4_ + auVar170._28_4_ + auVar217._28_4_;
    local_520._0_4_ = auVar95._0_4_;
    local_520._4_4_ = auVar95._4_4_;
    fStack_518 = auVar95._8_4_;
    fStack_514 = auVar95._12_4_;
    fStack_510 = auVar95._16_4_;
    fStack_50c = auVar95._20_4_;
    fStack_508 = auVar95._24_4_;
    uStack_504 = auVar95._28_4_;
    auVar73._4_4_ = fVar189 * (float)local_520._4_4_ * (float)local_520._4_4_;
    auVar73._0_4_ = fVar184 * (float)local_520._0_4_ * (float)local_520._0_4_;
    auVar73._8_4_ = fVar191 * fStack_518 * fStack_518;
    auVar73._12_4_ = fVar193 * fStack_514 * fStack_514;
    auVar73._16_4_ = fVar195 * fStack_510 * fStack_510;
    auVar73._20_4_ = fVar197 * fStack_50c * fStack_50c;
    auVar73._24_4_ = fVar199 * fStack_508 * fStack_508;
    auVar73._28_4_ = uStack_504;
    uVar91 = *(uint *)(ray + k * 4 + 0x80);
    auVar93 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar208 = vandnps_avx(auVar141,auVar186);
    auVar170 = vcmpps_avx(auVar107,auVar73,1);
    auVar74._4_4_ = fVar150 * -fVar177;
    auVar74._0_4_ = fVar151 * -fVar173;
    auVar74._8_4_ = fVar154 * -fVar178;
    auVar74._12_4_ = fVar155 * -fVar179;
    auVar74._16_4_ = fVar156 * -fVar180;
    auVar74._20_4_ = fVar157 * -fVar181;
    auVar74._24_4_ = fVar158 * -fVar182;
    auVar74._28_4_ = local_140;
    auVar170 = vblendvps_avx(auVar206,auVar74,auVar170);
    auVar208 = vblendvps_avx(auVar206,auVar170,auVar208);
    auVar220 = vminps_avx(local_440,auVar208);
    auVar170 = vmaxps_avx(local_440,auVar208);
    auVar222 = vminps_avx(local_480,auVar220);
    auVar217 = vcmpps_avx(auVar222,auVar220,0);
    auVar208 = vcmpps_avx(auVar206,auVar170,0);
    auVar207._8_4_ = 0xff800000;
    auVar207._0_8_ = 0xff800000ff800000;
    auVar207._12_4_ = 0xff800000;
    auVar207._16_4_ = 0xff800000;
    auVar207._20_4_ = 0xff800000;
    auVar207._24_4_ = 0xff800000;
    auVar207._28_4_ = 0xff800000;
    auVar208 = vblendvps_avx(auVar170,auVar207,auVar208);
    auVar170 = vcmpps_avx(auVar220,auVar206,0);
    auVar170 = vblendvps_avx(auVar220,auVar207,auVar170);
    auVar170 = vblendvps_avx(auVar170,auVar208,auVar217);
    auVar131._16_16_ = auVar93;
    auVar131._0_16_ = auVar93;
    auVar142._0_4_ = fVar116 + auVar222._0_4_;
    auVar142._4_4_ = fVar122 + auVar222._4_4_;
    auVar142._8_4_ = fStack_458 + auVar222._8_4_;
    auVar142._12_4_ = fStack_454 + auVar222._12_4_;
    auVar142._16_4_ = fStack_450 + auVar222._16_4_;
    auVar142._20_4_ = fStack_44c + auVar222._20_4_;
    auVar142._24_4_ = fStack_448 + auVar222._24_4_;
    auVar142._28_4_ = fStack_444 + auVar222._28_4_;
    auVar208 = vcmpps_avx(auVar131,auVar142,2);
    auStack_5b0 = auVar94._16_16_;
    local_5c0 = ZEXT416(uVar91);
    auVar93 = vshufps_avx(ZEXT416(uVar91),ZEXT416(uVar91),0);
    auVar162._16_16_ = auVar93;
    auVar162._0_16_ = auVar93;
    auVar217 = vcmpps_avx(auVar142,auVar162,2);
    auVar208 = vandps_avx(auVar217,auVar208);
    local_540 = vmaxps_avx(auVar175,auVar170);
    auVar170 = vcmpps_avx(auVar222,auVar206,4);
    auVar170 = vandps_avx(auVar186,auVar170);
    local_560 = vandps_avx(auVar208,auVar170);
    local_580._0_4_ = fVar116 + local_540._0_4_;
    local_580._4_4_ = fVar122 + local_540._4_4_;
    local_580._8_4_ = fStack_458 + local_540._8_4_;
    local_580._12_4_ = fStack_454 + local_540._12_4_;
    local_580._16_4_ = fStack_450 + local_540._16_4_;
    local_580._20_4_ = fStack_44c + local_540._20_4_;
    local_580._24_4_ = fStack_448 + local_540._24_4_;
    local_580._28_4_ = fStack_444 + local_540._28_4_;
    auVar208 = vcmpps_avx(auVar131,local_580,2);
    auVar170 = vcmpps_avx(local_580,auVar162,2);
    auVar208 = vandps_avx(auVar170,auVar208);
    auVar170 = vcmpps_avx(auVar207,local_540,4);
    auVar170 = vandps_avx(auVar186,auVar170);
    local_2a0 = vandps_avx(auVar208,auVar170);
    local_5e0 = vorps_avx(local_560,local_2a0);
    if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5e0 >> 0x7f,0) != '\0') ||
          (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5e0 >> 0xbf,0) != '\0') ||
        (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5e0[0x1f] < '\0') {
      auVar217 = vblendvps_avx(local_540,auVar222,local_560);
      auVar220 = vblendvps_avx(_local_4a0,auVar126,local_560);
      fVar127 = fVar183 * fVar111 * fVar127;
      fVar132 = fVar188 * fVar15 * fVar132;
      fVar133 = fVar190 * fVar22 * fVar133;
      fVar134 = fVar192 * fVar29 * fVar134;
      fVar135 = fVar194 * fVar36 * fVar135;
      fVar136 = fVar196 * fVar43 * fVar136;
      fVar137 = fVar198 * fVar50 * fVar137;
      local_2c0 = fVar100 * fVar127;
      fStack_2bc = fVar114 * fVar132;
      fStack_2b8 = fVar18 * fVar133;
      fStack_2b4 = fVar25 * fVar134;
      fStack_2b0 = fVar32 * fVar135;
      fStack_2ac = fVar39 * fVar136;
      fStack_2a4 = local_560._28_4_;
      fStack_2a8 = fVar46 * fVar137;
      auVar208 = vcmpps_avx(local_480,auVar217,0);
      auVar170 = vcmpps_avx(auVar217,auVar175,0);
      auVar208 = vorps_avx(auVar208,auVar170);
      auVar208 = vandps_avx(auVar186,auVar208);
      auVar222 = vcmpps_avx(local_440,auVar217,0);
      auVar170 = vandps_avx(auVar186,auVar222);
      fVar111 = auVar217._0_4_;
      fVar15 = auVar217._4_4_;
      fVar22 = auVar217._8_4_;
      fVar29 = auVar217._12_4_;
      fVar36 = auVar217._16_4_;
      fVar43 = auVar217._20_4_;
      fVar50 = auVar217._24_4_;
      auVar143._0_4_ = local_2c0 + fVar138 * (local_260 * fVar111 + fVar204);
      auVar143._4_4_ = fStack_2bc + fVar144 * (local_260 * fVar15 + fVar14);
      auVar143._8_4_ = fStack_2b8 + fVar145 * (local_260 * fVar22 + fVar21);
      auVar143._12_4_ = fStack_2b4 + fVar146 * (local_260 * fVar29 + fVar28);
      auVar143._16_4_ = fStack_2b0 + fVar147 * (local_260 * fVar36 + fVar35);
      auVar143._20_4_ = fStack_2ac + fVar148 * (local_260 * fVar43 + fVar42);
      auVar143._24_4_ = fStack_2a8 + fVar149 * (local_260 * fVar50 + fVar49);
      auVar143._28_4_ = fStack_2a4 + auVar222._28_4_ + (float)local_4e0._28_4_;
      fStack_31c = fVar114 * fStack_2dc;
      local_320 = fVar100 * local_2e0;
      fStack_318 = fVar18 * fStack_2d8;
      fStack_314 = fVar25 * fStack_2d4;
      fStack_310 = fVar32 * fStack_2d0;
      fStack_30c = fVar39 * fStack_2cc;
      fStack_308 = fVar46 * fStack_2c8;
      fStack_304 = fStack_444;
      fVar204 = auVar220._0_4_;
      fVar14 = auVar220._4_4_;
      auVar75._4_4_ = fVar114 * fStack_2dc * fVar14;
      auVar75._0_4_ = fVar100 * local_2e0 * fVar204;
      fVar100 = auVar220._8_4_;
      auVar75._8_4_ = fVar18 * fStack_2d8 * fVar100;
      fVar114 = auVar220._12_4_;
      auVar75._12_4_ = fVar25 * fStack_2d4 * fVar114;
      fVar21 = auVar220._16_4_;
      auVar75._16_4_ = fVar32 * fStack_2d0 * fVar21;
      fVar28 = auVar220._20_4_;
      auVar75._20_4_ = fVar39 * fStack_2cc * fVar28;
      fVar35 = auVar220._24_4_;
      auVar75._24_4_ = fVar46 * fStack_2c8 * fVar35;
      auVar75._28_4_ = local_440._28_4_;
      auVar220 = vsubps_avx(auVar143,auVar75);
      fStack_2fc = fVar113 * fVar132;
      local_300 = fVar203 * fVar127;
      fStack_2f8 = fVar17 * fVar133;
      fStack_2f4 = fVar24 * fVar134;
      fStack_2f0 = fVar31 * fVar135;
      fStack_2ec = fVar38 * fVar136;
      fStack_2e8 = fVar45 * fVar137;
      auVar169._0_4_ = fVar138 * (local_140 * fVar111 + fVar110) + fVar203 * fVar127;
      auVar169._4_4_ = fVar144 * (local_140 * fVar15 + fVar13) + fVar113 * fVar132;
      auVar169._8_4_ = fVar145 * (local_140 * fVar22 + fVar20) + fVar17 * fVar133;
      auVar169._12_4_ = fVar146 * (local_140 * fVar29 + fVar27) + fVar24 * fVar134;
      auVar169._16_4_ = fVar147 * (local_140 * fVar36 + fVar34) + fVar31 * fVar135;
      auVar169._20_4_ = fVar148 * (local_140 * fVar43 + fVar41) + fVar38 * fVar136;
      auVar169._24_4_ = fVar149 * (local_140 * fVar50 + fVar48) + fVar45 * fVar137;
      auVar169._28_4_ = local_440._28_4_ + (float)local_4c0._28_4_ + fStack_2e4;
      local_80 = fVar203 * local_2e0;
      fStack_7c = fVar113 * fStack_2dc;
      fStack_78 = fVar17 * fStack_2d8;
      fStack_74 = fVar24 * fStack_2d4;
      fStack_70 = fVar31 * fStack_2d0;
      fStack_6c = fVar38 * fStack_2cc;
      fStack_68 = fVar45 * fStack_2c8;
      fStack_64 = fStack_2e4;
      auVar76._4_4_ = fVar14 * fVar113 * fStack_2dc;
      auVar76._0_4_ = fVar204 * fVar203 * local_2e0;
      auVar76._8_4_ = fVar100 * fVar17 * fStack_2d8;
      auVar76._12_4_ = fVar114 * fVar24 * fStack_2d4;
      auVar76._16_4_ = fVar21 * fVar31 * fStack_2d0;
      auVar76._20_4_ = fVar28 * fVar38 * fStack_2cc;
      auVar76._24_4_ = fVar35 * fVar45 * fStack_2c8;
      auVar76._28_4_ = local_480._28_4_;
      auVar222 = vsubps_avx(auVar169,auVar76);
      local_c0._0_8_ = local_5a0._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar18;
      local_c0._12_4_ = -fVar25;
      local_c0._16_4_ = -fVar32;
      local_c0._20_4_ = -fVar39;
      local_c0._24_4_ = -fVar46;
      local_c0._28_4_ = -local_5a0._28_4_;
      auVar186 = vblendvps_avx(local_5a0,local_c0,auVar170);
      local_1c0 = vblendvps_avx(auVar186,auVar220,auVar208);
      local_2e0 = fVar201 * local_2e0;
      fStack_2dc = fVar112 * fStack_2dc;
      fStack_2d8 = fVar16 * fStack_2d8;
      fStack_2d4 = fVar23 * fStack_2d4;
      fStack_2d0 = fVar30 * fStack_2d0;
      fStack_2cc = fVar37 * fStack_2cc;
      fStack_2c8 = fVar44 * fStack_2c8;
      local_a0 = fVar201 * fVar127;
      fStack_9c = fVar112 * fVar132;
      fStack_98 = fVar16 * fVar133;
      fStack_94 = fVar23 * fVar134;
      fStack_90 = fVar30 * fVar135;
      fStack_8c = fVar37 * fVar136;
      fStack_88 = fVar44 * fVar137;
      fStack_84 = local_c0._28_4_;
      auVar163._0_4_ = fVar201 * fVar127 + fVar138 * (fVar109 + fVar111 * local_280);
      auVar163._4_4_ = fVar112 * fVar132 + fVar144 * (fVar115 + fVar15 * local_280);
      auVar163._8_4_ = fVar16 * fVar133 + fVar145 * (fVar19 + fVar22 * local_280);
      auVar163._12_4_ = fVar23 * fVar134 + fVar146 * (fVar26 + fVar29 * local_280);
      auVar163._16_4_ = fVar30 * fVar135 + fVar147 * (fVar33 + fVar36 * local_280);
      auVar163._20_4_ = fVar37 * fVar136 + fVar148 * (fVar40 + fVar43 * local_280);
      auVar163._24_4_ = fVar44 * fVar137 + fVar149 * (fVar47 + fVar50 * local_280);
      auVar163._28_4_ = local_c0._28_4_ + fVar123 + local_5a0._28_4_;
      auVar77._4_4_ = fVar14 * fStack_2dc;
      auVar77._0_4_ = fVar204 * local_2e0;
      auVar77._8_4_ = fVar100 * fStack_2d8;
      auVar77._12_4_ = fVar114 * fStack_2d4;
      auVar77._16_4_ = fVar21 * fStack_2d0;
      auVar77._20_4_ = fVar28 * fStack_2cc;
      auVar77._24_4_ = fVar35 * fStack_2c8;
      auVar77._28_4_ = auVar186._28_4_;
      local_100._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar17;
      local_100._12_4_ = -fVar24;
      local_100._16_4_ = -fVar31;
      local_100._20_4_ = -fVar38;
      local_100._24_4_ = -fVar45;
      local_100._28_4_ = -local_3e0._28_4_;
      auVar186 = vblendvps_avx(local_3e0,local_100,auVar170);
      auVar220 = vsubps_avx(auVar163,auVar77);
      local_1a0 = vblendvps_avx(auVar186,auVar222,auVar208);
      local_120._0_8_ = local_400._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar16;
      local_120._12_4_ = -fVar23;
      local_120._16_4_ = -fVar30;
      local_120._20_4_ = -fVar37;
      local_120._24_4_ = -fVar44;
      local_120._28_4_ = local_400._28_4_ ^ 0x80000000;
      auVar186 = vblendvps_avx(local_400,local_120,auVar170);
      local_180 = vblendvps_avx(auVar186,auVar220,auVar208);
      auVar85._4_4_ = fVar188;
      auVar85._0_4_ = fVar183;
      auVar85._8_4_ = fVar190;
      auVar85._12_4_ = fVar192;
      auVar85._16_4_ = fVar194;
      auVar85._20_4_ = fVar196;
      auVar85._24_4_ = fVar198;
      auVar85._28_4_ = fVar200;
      auVar186 = vrcpps_avx(auVar85);
      local_500 = auVar186._0_4_;
      fStack_4fc = auVar186._4_4_;
      auVar78._4_4_ = fStack_4fc * fVar188;
      auVar78._0_4_ = local_500 * fVar183;
      fStack_4f8 = auVar186._8_4_;
      auVar78._8_4_ = fStack_4f8 * fVar190;
      fStack_4f4 = auVar186._12_4_;
      auVar78._12_4_ = fStack_4f4 * fVar192;
      fStack_4f0 = auVar186._16_4_;
      auVar78._16_4_ = fStack_4f0 * fVar194;
      fStack_4ec = auVar186._20_4_;
      auVar78._20_4_ = fStack_4ec * fVar196;
      fStack_4e8 = auVar186._24_4_;
      auVar78._24_4_ = fStack_4e8 * fVar198;
      auVar78._28_4_ = local_c0._28_4_;
      auVar185._8_4_ = 0x3f800000;
      auVar185._0_8_ = 0x3f8000003f800000;
      auVar185._12_4_ = 0x3f800000;
      auVar185._16_4_ = 0x3f800000;
      auVar185._20_4_ = 0x3f800000;
      auVar185._24_4_ = 0x3f800000;
      auVar185._28_4_ = 0x3f800000;
      auVar220 = vsubps_avx(auVar185,auVar78);
      local_500 = local_500 + local_500 * auVar220._0_4_;
      fStack_4fc = fStack_4fc + fStack_4fc * auVar220._4_4_;
      fStack_4f8 = fStack_4f8 + fStack_4f8 * auVar220._8_4_;
      fStack_4f4 = fStack_4f4 + fStack_4f4 * auVar220._12_4_;
      fStack_4f0 = fStack_4f0 + fStack_4f0 * auVar220._16_4_;
      fStack_4ec = fStack_4ec + fStack_4ec * auVar220._20_4_;
      fStack_4e8 = fStack_4e8 + fStack_4e8 * auVar220._24_4_;
      fStack_4e4 = auVar186._28_4_ + auVar220._28_4_;
      local_e0 = vblendvps_avx(auVar185,ZEXT832(0) << 0x20,auVar170);
      auVar79._4_4_ = fVar14 * fStack_4fc;
      auVar79._0_4_ = fVar204 * local_500;
      auVar79._8_4_ = fVar100 * fStack_4f8;
      auVar79._12_4_ = fVar114 * fStack_4f4;
      auVar79._16_4_ = fVar21 * fStack_4f0;
      auVar79._20_4_ = fVar28 * fStack_4ec;
      auVar79._24_4_ = fVar35 * fStack_4e8;
      auVar79._28_4_ = local_5e0._28_4_;
      local_220 = vblendvps_avx(local_e0,auVar79,auVar208);
      local_1e0._0_4_ = fVar111 + fVar116;
      local_1e0._4_4_ = fVar15 + fVar122;
      local_1e0._8_4_ = fVar22 + fStack_458;
      local_1e0._12_4_ = fVar29 + fStack_454;
      local_1e0._16_4_ = fVar36 + fStack_450;
      local_1e0._20_4_ = fVar43 + fStack_44c;
      local_1e0._24_4_ = fVar50 + fStack_448;
      local_1e0._28_4_ = auVar217._28_4_ + fStack_444;
      local_200 = ZEXT832(0) << 0x20;
      uVar91 = vmovmskps_avx(local_5e0);
      uVar92 = (ulong)uVar91;
      pauVar88 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar208 = vcmpps_avx(local_1c0,local_1c0,0xf);
      auVar209 = ZEXT3264(auVar208);
      auVar165 = ZEXT3264(local_3e0);
      auVar172 = ZEXT3264(local_400);
      auVar176 = ZEXT3264(local_4c0);
      auVar187 = ZEXT3264(local_420);
      auVar221 = ZEXT3264(local_4e0);
      auVar223 = ZEXT3264(local_5a0);
      auVar218 = ZEXT3264(local_580);
      local_618 = pSVar87;
      _local_520 = auVar175;
      fStack_27c = local_280;
      fStack_278 = local_280;
      fStack_274 = local_280;
      fStack_270 = local_280;
      fStack_26c = local_280;
      fStack_268 = local_280;
      fStack_264 = local_280;
      fStack_25c = local_260;
      fStack_258 = local_260;
      fStack_254 = local_260;
      fStack_250 = local_260;
      fStack_24c = local_260;
      fStack_248 = local_260;
      fStack_244 = local_260;
      do {
        auVar170 = auVar172._0_32_;
        auVar208 = auVar165._0_32_;
        local_610.valid = (int *)local_630;
        auVar186 = auVar187._0_32_;
        auVar175 = auVar176._0_32_;
        auVar220 = auVar221._0_32_;
        auVar222 = auVar223._0_32_;
        auVar217 = auVar218._0_32_;
        uVar12 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar91 = *(uint *)(local_240 + uVar12 * 4);
        pGVar9 = (pSVar87->geometries).items[uVar91].ptr;
        local_610.ray = (RTCRayN *)ray;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar90 = true, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0095fba1;
          local_380 = *(undefined4 *)(local_220 + uVar12 * 4);
          uVar89 = *(undefined4 *)(local_200 + uVar12 * 4);
          local_370._4_4_ = uVar89;
          local_370._0_4_ = uVar89;
          local_370._8_4_ = uVar89;
          local_370._12_4_ = uVar89;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_610.context = context->user;
          local_350 = vpshufd_avx(ZEXT416(uVar91),0);
          uVar91 = (line->primIDs).field_0.i[uVar12];
          local_360._4_4_ = uVar91;
          local_360._0_4_ = uVar91;
          local_360._8_4_ = uVar91;
          local_360._12_4_ = uVar91;
          uVar89 = *(undefined4 *)(local_1c0 + uVar12 * 4);
          local_3b0._4_4_ = uVar89;
          local_3b0._0_4_ = uVar89;
          local_3b0._8_4_ = uVar89;
          local_3b0._12_4_ = uVar89;
          uVar89 = *(undefined4 *)(local_1a0 + uVar12 * 4);
          local_3a0._4_4_ = uVar89;
          local_3a0._0_4_ = uVar89;
          local_3a0._8_4_ = uVar89;
          local_3a0._12_4_ = uVar89;
          uVar89 = *(undefined4 *)(local_180 + uVar12 * 4);
          local_390._4_4_ = uVar89;
          local_390._0_4_ = uVar89;
          local_390._8_4_ = uVar89;
          local_390._12_4_ = uVar89;
          uStack_33c = (local_610.context)->instID[0];
          local_340 = uStack_33c;
          uStack_338 = uStack_33c;
          uStack_334 = uStack_33c;
          uStack_330 = (local_610.context)->instPrimID[0];
          uStack_32c = uStack_330;
          uStack_328 = uStack_330;
          uStack_324 = uStack_330;
          local_630 = *pauVar88;
          local_610.geometryUserPtr = pGVar9->userPtr;
          local_610.hit = local_3b0;
          local_610.N = 4;
          local_5e0._0_8_ = pauVar88;
          uStack_37c = local_380;
          uStack_378 = local_380;
          uStack_374 = local_380;
          auVar93 = local_370;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar208 = ZEXT1632(auVar209._0_16_);
            local_620 = k;
            (*pGVar9->occlusionFilterN)(&local_610);
            auVar208 = vcmpps_avx(auVar208,auVar208,0xf);
            auVar209 = ZEXT3264(auVar208);
            auVar218 = ZEXT3264(local_580);
            auVar223 = ZEXT3264(local_5a0);
            auVar221 = ZEXT3264(local_4e0);
            auVar187 = ZEXT3264(local_420);
            auVar176 = ZEXT3264(local_4c0);
            auVar172 = ZEXT3264(local_400);
            auVar165 = ZEXT3264(local_3e0);
            pSVar87 = local_618;
            k = local_620;
            pauVar88 = (undefined1 (*) [16])local_5e0._0_8_;
          }
          if (local_630 == (undefined1  [16])0x0) {
            auVar101 = ZEXT816(0);
            auVar93 = vpcmpeqd_avx((undefined1  [16])0x0,auVar101);
            auVar101 = vpcmpeqd_avx(auVar101,auVar101);
            auVar93 = auVar93 ^ auVar101;
          }
          else {
            p_Var11 = context->args->filter;
            auVar101 = ZEXT816(0);
            auVar93 = vpcmpeqd_avx(auVar93,auVar93);
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              auVar208 = ZEXT1632(auVar209._0_16_);
              (*p_Var11)(&local_610);
              auVar93 = vpcmpeqd_avx(auVar93,auVar93);
              auVar101 = ZEXT816(0) << 0x40;
              auVar208 = vcmpps_avx(auVar208,auVar208,0xf);
              auVar209 = ZEXT3264(auVar208);
              auVar218 = ZEXT3264(local_580);
              auVar223 = ZEXT3264(local_5a0);
              auVar221 = ZEXT3264(local_4e0);
              auVar187 = ZEXT3264(local_420);
              auVar176 = ZEXT3264(local_4c0);
              auVar172 = ZEXT3264(local_400);
              auVar165 = ZEXT3264(local_3e0);
              pSVar87 = local_618;
              pauVar88 = (undefined1 (*) [16])local_5e0._0_8_;
            }
            auVar101 = vpcmpeqd_avx(local_630,auVar101);
            auVar93 = auVar101 ^ auVar93;
            auVar117._8_4_ = 0xff800000;
            auVar117._0_8_ = 0xff800000ff800000;
            auVar117._12_4_ = 0xff800000;
            auVar101 = vblendvps_avx(auVar117,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar101)
            ;
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar101;
          }
          auVar170 = auVar172._0_32_;
          auVar208 = auVar165._0_32_;
          auVar186 = auVar187._0_32_;
          auVar175 = auVar176._0_32_;
          auVar220 = auVar221._0_32_;
          auVar222 = auVar223._0_32_;
          auVar217 = auVar218._0_32_;
          auVar101._8_8_ = 0x100000001;
          auVar101._0_8_ = 0x100000001;
          if ((auVar101 & auVar93) != (undefined1  [16])0x0) {
            local_5c0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            bVar90 = true;
            goto LAB_0095fba1;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
        }
        auVar170 = auVar172._0_32_;
        auVar208 = auVar165._0_32_;
        auVar186 = auVar187._0_32_;
        auVar175 = auVar176._0_32_;
        auVar220 = auVar221._0_32_;
        auVar222 = auVar223._0_32_;
        auVar217 = auVar218._0_32_;
        uVar92 = uVar92 ^ 1L << (uVar12 & 0x3f);
      } while (uVar92 != 0);
      bVar90 = false;
LAB_0095fba1:
      auVar94 = vandps_avx(local_2a0,local_560);
      auVar93 = vpermilps_avx(local_5c0,0);
      auVar108._16_16_ = auVar93;
      auVar108._0_16_ = auVar93;
      auVar95 = vcmpps_avx(auVar217,auVar108,2);
      auVar51 = auVar94 & auVar95;
      if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar51 >> 0x7f,0) == '\0') &&
            (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar51 >> 0xbf,0) == '\0') &&
          (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar51[0x1f])
      {
        return bVar90;
      }
      auVar52 = vcmpps_avx(local_540,local_440,0);
      auVar222 = vblendvps_avx(auVar222,local_c0,auVar52);
      auVar51 = vblendvps_avx(auVar208,local_100,auVar52);
      auVar52 = vblendvps_avx(auVar170,local_120,auVar52);
      auVar103 = vcmpps_avx(local_540,local_480,0);
      auVar104 = vcmpps_avx(local_540,_local_520,0);
      auVar103 = vorps_avx(auVar103,auVar104);
      fVar201 = local_540._0_4_;
      fVar203 = local_540._4_4_;
      fVar204 = local_540._8_4_;
      fVar100 = local_540._12_4_;
      fVar109 = local_540._16_4_;
      fVar110 = local_540._20_4_;
      fVar111 = local_540._24_4_;
      auVar153._0_4_ = (float)local_160._0_4_ * (auVar220._0_4_ + fVar201 * local_260) + local_2c0;
      auVar153._4_4_ = (float)local_160._4_4_ * (auVar220._4_4_ + fVar203 * fStack_25c) + fStack_2bc
      ;
      auVar153._8_4_ = fStack_158 * (auVar220._8_4_ + fVar204 * fStack_258) + fStack_2b8;
      auVar153._12_4_ = fStack_154 * (auVar220._12_4_ + fVar100 * fStack_254) + fStack_2b4;
      auVar153._16_4_ = fStack_150 * (auVar220._16_4_ + fVar109 * fStack_250) + fStack_2b0;
      auVar153._20_4_ = fStack_14c * (auVar220._20_4_ + fVar110 * fStack_24c) + fStack_2ac;
      auVar153._24_4_ = fStack_148 * (auVar220._24_4_ + fVar111 * fStack_248) + fStack_2a8;
      auVar153._28_4_ = auVar220._28_4_ + auVar104._28_4_ + fStack_2a4;
      auVar164._0_4_ = (float)local_160._0_4_ * (auVar175._0_4_ + fVar201 * local_140) + local_300;
      auVar164._4_4_ = (float)local_160._4_4_ * (auVar175._4_4_ + fVar203 * fStack_13c) + fStack_2fc
      ;
      auVar164._8_4_ = fStack_158 * (auVar175._8_4_ + fVar204 * fStack_138) + fStack_2f8;
      auVar164._12_4_ = fStack_154 * (auVar175._12_4_ + fVar100 * fStack_134) + fStack_2f4;
      auVar164._16_4_ = fStack_150 * (auVar175._16_4_ + fVar109 * fStack_130) + fStack_2f0;
      auVar164._20_4_ = fStack_14c * (auVar175._20_4_ + fVar110 * fStack_12c) + fStack_2ec;
      auVar164._24_4_ = fStack_148 * (auVar175._24_4_ + fVar111 * fStack_128) + fStack_2e8;
      auVar164._28_4_ = auVar175._28_4_ + auVar208._28_4_ + fStack_2e4;
      auVar171._0_4_ = (float)local_160._0_4_ * (auVar186._0_4_ + fVar201 * local_280) + local_a0;
      auVar171._4_4_ = (float)local_160._4_4_ * (auVar186._4_4_ + fVar203 * fStack_27c) + fStack_9c;
      auVar171._8_4_ = fStack_158 * (auVar186._8_4_ + fVar204 * fStack_278) + fStack_98;
      auVar171._12_4_ = fStack_154 * (auVar186._12_4_ + fVar100 * fStack_274) + fStack_94;
      auVar171._16_4_ = fStack_150 * (auVar186._16_4_ + fVar109 * fStack_270) + fStack_90;
      auVar171._20_4_ = fStack_14c * (auVar186._20_4_ + fVar110 * fStack_26c) + fStack_8c;
      auVar171._24_4_ = fStack_148 * (auVar186._24_4_ + fVar111 * fStack_268) + fStack_88;
      auVar171._28_4_ = auVar186._28_4_ + auVar170._28_4_ + fStack_84;
      auVar93._0_4_ = (float)local_4a0._0_4_ * local_320;
      auVar93._4_4_ = (float)local_4a0._4_4_ * fStack_31c;
      auVar93._8_4_ = fStack_498 * fStack_318;
      auVar93._12_4_ = fStack_494 * fStack_314;
      auVar80._16_4_ = fStack_490 * fStack_310;
      auVar80._0_16_ = auVar93;
      auVar80._20_4_ = fStack_48c * fStack_30c;
      auVar80._24_4_ = fStack_488 * fStack_308;
      auVar80._28_4_ = uStack_144;
      auVar208 = vsubps_avx(auVar153,auVar80);
      local_1c0 = vblendvps_avx(auVar222,auVar208,auVar103);
      auVar81._4_4_ = (float)local_4a0._4_4_ * fStack_7c;
      auVar81._0_4_ = (float)local_4a0._0_4_ * local_80;
      auVar81._8_4_ = fStack_498 * fStack_78;
      auVar81._12_4_ = fStack_494 * fStack_74;
      auVar81._16_4_ = fStack_490 * fStack_70;
      auVar81._20_4_ = fStack_48c * fStack_6c;
      auVar81._24_4_ = fStack_488 * fStack_68;
      auVar81._28_4_ = auVar208._28_4_;
      auVar208 = vsubps_avx(auVar164,auVar81);
      local_1a0 = vblendvps_avx(auVar51,auVar208,auVar103);
      auVar82._4_4_ = (float)local_4a0._4_4_ * fStack_2dc;
      auVar82._0_4_ = (float)local_4a0._0_4_ * local_2e0;
      auVar82._8_4_ = fStack_498 * fStack_2d8;
      auVar82._12_4_ = fStack_494 * fStack_2d4;
      auVar82._16_4_ = fStack_490 * fStack_2d0;
      auVar82._20_4_ = fStack_48c * fStack_2cc;
      auVar82._24_4_ = fStack_488 * fStack_2c8;
      auVar82._28_4_ = auVar208._28_4_;
      auVar208 = vsubps_avx(auVar171,auVar82);
      local_180 = vblendvps_avx(auVar52,auVar208,auVar103);
      auVar83._4_4_ = (float)local_4a0._4_4_ * fStack_4fc;
      auVar83._0_4_ = (float)local_4a0._0_4_ * local_500;
      auVar83._8_4_ = fStack_498 * fStack_4f8;
      auVar83._12_4_ = fStack_494 * fStack_4f4;
      auVar83._16_4_ = fStack_490 * fStack_4f0;
      auVar83._20_4_ = fStack_48c * fStack_4ec;
      auVar83._24_4_ = fStack_488 * fStack_4e8;
      auVar83._28_4_ = auVar208._28_4_;
      local_220 = vblendvps_avx(local_e0,auVar83,auVar103);
      auVar208 = vandps_avx(auVar95,auVar94);
      local_200 = ZEXT832(0) << 0x20;
      local_1e0 = auVar217;
      pSVar87 = context->scene;
      uVar89 = vmovmskps_avx(auVar208);
      uVar92 = CONCAT44((int)((ulong)line >> 0x20),uVar89);
      auVar208 = vcmpps_avx(local_e0,local_e0,0xf);
      auVar165 = ZEXT3264(auVar208);
      auVar172 = ZEXT464(0) << 0x20;
      auVar93 = vpcmpeqd_avx(auVar93,auVar93);
      auVar176 = ZEXT1664(auVar93);
      local_460 = line;
      do {
        local_610.valid = (int *)local_630;
        uVar12 = 0;
        if (uVar92 != 0) {
          for (; (uVar92 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar91 = *(uint *)(local_240 + uVar12 * 4);
        pGVar9 = (pSVar87->geometries).items[uVar91].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar86 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0095ff82;
          local_380 = *(undefined4 *)(local_220 + uVar12 * 4);
          uVar89 = *(undefined4 *)(local_200 + uVar12 * 4);
          local_370._4_4_ = uVar89;
          local_370._0_4_ = uVar89;
          local_370._8_4_ = uVar89;
          local_370._12_4_ = uVar89;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_610.context = context->user;
          local_350 = vpshufd_avx(ZEXT416(uVar91),0);
          uVar91 = (local_460->primIDs).field_0.i[uVar12];
          local_360._4_4_ = uVar91;
          local_360._0_4_ = uVar91;
          local_360._8_4_ = uVar91;
          local_360._12_4_ = uVar91;
          uVar89 = *(undefined4 *)(local_1c0 + uVar12 * 4);
          local_3b0._4_4_ = uVar89;
          local_3b0._0_4_ = uVar89;
          local_3b0._8_4_ = uVar89;
          local_3b0._12_4_ = uVar89;
          uVar89 = *(undefined4 *)(local_1a0 + uVar12 * 4);
          local_3a0._4_4_ = uVar89;
          local_3a0._0_4_ = uVar89;
          local_3a0._8_4_ = uVar89;
          local_3a0._12_4_ = uVar89;
          uVar89 = *(undefined4 *)(local_180 + uVar12 * 4);
          local_390._4_4_ = uVar89;
          local_390._0_4_ = uVar89;
          local_390._8_4_ = uVar89;
          local_390._12_4_ = uVar89;
          uStack_33c = (local_610.context)->instID[0];
          local_340 = uStack_33c;
          uStack_338 = uStack_33c;
          uStack_334 = uStack_33c;
          uStack_330 = (local_610.context)->instPrimID[0];
          uStack_32c = uStack_330;
          uStack_328 = uStack_330;
          uStack_324 = uStack_330;
          local_630 = *pauVar88;
          local_610.geometryUserPtr = pGVar9->userPtr;
          local_610.hit = local_3b0;
          local_610.N = 4;
          local_5e0._0_8_ = pauVar88;
          local_610.ray = (RTCRayN *)ray;
          uStack_37c = local_380;
          uStack_378 = local_380;
          uStack_374 = local_380;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar208 = ZEXT1632(auVar165._0_16_);
            auVar93 = auVar176._0_16_;
            local_620 = k;
            (*pGVar9->occlusionFilterN)(&local_610);
            auVar93 = vpcmpeqd_avx(auVar93,auVar93);
            auVar176 = ZEXT1664(auVar93);
            auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar208 = vcmpps_avx(auVar208,auVar208,0xf);
            auVar165 = ZEXT3264(auVar208);
            k = local_620;
            pauVar88 = (undefined1 (*) [16])local_5e0._0_8_;
          }
          auVar93 = auVar176._0_16_;
          if (local_630 == (undefined1  [16])0x0) {
            auVar101 = vpcmpeqd_avx(auVar172._0_16_,(undefined1  [16])0x0);
            auVar93 = auVar93 ^ auVar101;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              auVar208 = ZEXT1632(auVar165._0_16_);
              (*p_Var11)(&local_610);
              auVar93 = vpcmpeqd_avx(auVar93,auVar93);
              auVar176 = ZEXT1664(auVar93);
              auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar208 = vcmpps_avx(auVar208,auVar208,0xf);
              auVar165 = ZEXT3264(auVar208);
              pauVar88 = (undefined1 (*) [16])local_5e0._0_8_;
            }
            auVar101 = vpcmpeqd_avx(auVar172._0_16_,local_630);
            auVar93 = auVar176._0_16_ ^ auVar101;
            auVar118._8_4_ = 0xff800000;
            auVar118._0_8_ = 0xff800000ff800000;
            auVar118._12_4_ = 0xff800000;
            auVar101 = vblendvps_avx(auVar118,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar101)
            ;
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar101;
          }
          auVar102._8_8_ = 0x100000001;
          auVar102._0_8_ = 0x100000001;
          if ((auVar102 & auVar93) != (undefined1  [16])0x0) {
            bVar86 = 1;
            goto LAB_0095ff82;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
        }
        uVar92 = uVar92 ^ 1L << (uVar12 & 0x3f);
        if (uVar92 == 0) {
          bVar86 = 0;
LAB_0095ff82:
          return (bool)(bVar90 | bVar86);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }